

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O3

int lj_cf_string_gmatch_aux(lua_State *L)

{
  char *pcVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  char *e;
  char *s;
  ulong uVar5;
  MatchState ms;
  MatchState local_250;
  
  uVar5 = (ulong)L->base[-1].u32.lo;
  uVar4 = (ulong)*(uint *)(uVar5 + 0x20);
  uVar2 = *(uint *)(uVar5 + 0x28);
  pcVar1 = (char *)(uVar4 + 0x10);
  local_250.src_end = (char *)(uVar4 + *(uint *)(uVar4 + 0xc) + 0x10);
  if (*(uint *)(uVar5 + 0x30) <= *(uint *)(uVar4 + 0xc)) {
    s = pcVar1 + *(uint *)(uVar5 + 0x30);
    local_250.src_init = pcVar1;
    local_250.L = L;
    do {
      local_250.level = 0;
      local_250.depth = 0;
      e = match(&local_250,s,(char *)((ulong)uVar2 + 0x10));
      if (e != (char *)0x0) {
        *(uint *)(uVar5 + 0x30) = (uint)(s == e) + ((int)e - (int)pcVar1);
        iVar3 = push_captures(&local_250,s,e);
        return iVar3;
      }
      s = s + 1;
    } while (s <= local_250.src_end);
  }
  return 0;
}

Assistant:

LJLIB_NOREG LJLIB_CF(string_gmatch_aux)
{
  const char *p = strVdata(lj_lib_upvalue(L, 2));
  GCstr *str = strV(lj_lib_upvalue(L, 1));
  const char *s = strdata(str);
  TValue *tvpos = lj_lib_upvalue(L, 3);
  const char *src = s + tvpos->u32.lo;
  MatchState ms;
  ms.L = L;
  ms.src_init = s;
  ms.src_end = s + str->len;
  for (; src <= ms.src_end; src++) {
    const char *e;
    ms.level = ms.depth = 0;
    if ((e = match(&ms, src, p)) != NULL) {
      int32_t pos = (int32_t)(e - s);
      if (e == src) pos++;  /* Ensure progress for empty match. */
      tvpos->u32.lo = (uint32_t)pos;
      return push_captures(&ms, src, e);
    }
  }
  return 0;  /* not found */
}